

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

VP8LHistogramSet * VP8LAllocateHistogramSet(int size,int cache_bits)

{
  VP8LHistogram *pVVar1;
  int iVar2;
  VP8LHistogramSet *set;
  ulong uVar3;
  
  iVar2 = (4 << ((byte)cache_bits & 0x1f)) + 0x1150;
  if (cache_bits < 1) {
    iVar2 = 0x1150;
  }
  set = (VP8LHistogramSet *)WebPSafeMalloc(((long)iVar2 + 0x27) * (long)size + 0x10,1);
  if (set == (VP8LHistogramSet *)0x0) {
    set = (VP8LHistogramSet *)0x0;
  }
  else {
    set->histograms = (VP8LHistogram **)(set + 1);
    set->max_size = size;
    set->size = size;
    HistogramSetResetPointers(set,cache_bits);
    if (0 < size) {
      uVar3 = 0;
      do {
        pVVar1 = set->histograms[uVar3];
        pVVar1->palette_code_bits = cache_bits;
        pVVar1->trivial_symbol[0] = 0xffff;
        pVVar1->trivial_symbol[1] = 0xffff;
        pVVar1->trivial_symbol[2] = 0xffff;
        pVVar1->trivial_symbol[3] = 0xffff;
        pVVar1->trivial_symbol[4] = 0xffff;
        builtin_memcpy(pVVar1->is_used,"\x01\x01\x01\x01\x01",5);
        pVVar1->bit_cost = 0;
        pVVar1->costs[0] = 0;
        pVVar1->costs[1] = 0;
        pVVar1->costs[2] = 0;
        pVVar1->costs[3] = 0;
        pVVar1->costs[4] = 0;
        uVar3 = uVar3 + 1;
      } while ((uint)size != uVar3);
    }
  }
  return set;
}

Assistant:

VP8LHistogramSet* VP8LAllocateHistogramSet(int size, int cache_bits) {
  int i;
  VP8LHistogramSet* set;
  const size_t total_size = HistogramSetTotalSize(size, cache_bits);
  uint8_t* memory = (uint8_t*)WebPSafeMalloc(total_size, sizeof(*memory));
  if (memory == NULL) return NULL;

  set = (VP8LHistogramSet*)memory;
  memory += sizeof(*set);
  set->histograms = (VP8LHistogram**)memory;
  set->max_size = size;
  set->size = size;
  HistogramSetResetPointers(set, cache_bits);
  for (i = 0; i < size; ++i) {
    VP8LHistogramInit(set->histograms[i], cache_bits, /*init_arrays=*/ 0);
  }
  return set;
}